

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O3

const_iterator * __thiscall
plot::
Alignment<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
::cend(const_iterator *__return_storage_ptr__,
      Alignment<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
      *this)

{
  HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *this_00;
  long lVar1;
  size_t left_margin;
  long lVar2;
  long lVar3;
  size_t sVar4;
  Size SVar5;
  const_iterator local_1110;
  const_iterator local_ce0;
  alignment_line<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
  local_8b0;
  
  this_00 = &(this->block_).block_;
  SVar5 = HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          ::size(this_00);
  lVar3 = SVar5.x + (this->block_).left_ + (this->block_).right_;
  lVar2 = SVar5.y + (this->block_).top_ + (this->block_).bottom_;
  lVar1 = (this->size_).x;
  if (lVar3 <= lVar1) {
    lVar3 = lVar1;
  }
  lVar1 = (this->size_).y;
  if (lVar2 <= lVar1) {
    lVar2 = lVar1;
  }
  SVar5 = HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          ::size(this_00);
  lVar2 = lVar2 - (SVar5.y + (this->block_).top_ + (this->block_).bottom_);
  if (this->valign_ == Middle) {
    lVar1 = lVar2 / 2;
  }
  else {
    lVar1 = 0;
    if (this->valign_ == Bottom) {
      lVar1 = lVar2;
    }
  }
  sVar4 = lVar3 - (SVar5.x + (this->block_).left_ + (this->block_).right_);
  if (this->halign_ == Center) {
    left_margin = (long)sVar4 / 2;
  }
  else {
    left_margin = 0;
    if (this->halign_ == Right) {
      left_margin = sVar4;
    }
  }
  Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  ::cend(&local_1110,&this->block_);
  Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  ::cend(&local_ce0,&this->block_);
  detail::
  alignment_line<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
  ::alignment_line(&local_8b0,this,left_margin,sVar4 - left_margin,lVar2 - lVar1,&local_1110,
                   &local_ce0);
  detail::
  block_iterator<plot::Alignment<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>,_plot::detail::alignment_line<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>_>
  ::block_iterator(__return_storage_ptr__,&local_8b0);
  return __return_storage_ptr__;
}

Assistant:

const_iterator cend() const {
        auto sz = size();
        auto block_sz = detail::block_traits<Block>::size(block_);

        auto hmargin = sz.x - block_sz.x,
             vmargin = sz.y - block_sz.y;
        auto top = (valign_ == VAlign::Middle) ? vmargin / 2
                                               : (valign_ == VAlign::Bottom) ? vmargin : 0;
        auto left = (halign_ == Align::Center) ? hmargin / 2
                                              : (halign_ == Align::Right) ? hmargin : 0;

        return { { this, std::size_t(left), std::size_t(hmargin - left), std::ptrdiff_t(vmargin - top),
                   detail::block_traits<Block>::end(block_), detail::block_traits<Block>::end(block_) } };
    }